

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

Status * __thiscall
draco::PointCloudEncoder::Encode
          (PointCloudEncoder *this,EncoderOptions *options,EncoderBuffer *out_buffer)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  EncoderBuffer *in_RCX;
  EncoderOptions *in_RDX;
  PointCloudEncoder *in_RSI;
  Status *in_RDI;
  Status *_local_status;
  undefined4 in_stack_fffffffffffffe98;
  Code in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  PointCloudEncoder *in_stack_fffffffffffffec8;
  allocator<char> *in_stack_fffffffffffffed0;
  allocator<char> *__a;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_f9;
  string local_f8 [39];
  allocator<char> local_d1;
  string local_d0 [38];
  byte local_aa;
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [35];
  byte local_5d;
  uint local_5c;
  byte local_55;
  undefined1 local_41 [65];
  
  in_RSI->options_ = in_RDX;
  in_RSI->buffer_ = in_RCX;
  std::
  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
  ::clear((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
           *)0x1aeca2);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1aecb0);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1aecbe);
  if (in_RSI->point_cloud_ == (PointCloud *)0x0) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffedf,
                                        CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8
                                                )),in_stack_fffffffffffffed0);
    Status::Status((Status *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c,(string *)0x1aed12);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
  }
  else {
    local_55 = 0;
    EncodeHeader(in_stack_fffffffffffffec8);
    uVar1 = Status::ok(in_RDI);
    if (!(bool)uVar1) {
      local_55 = 1;
    }
    local_5c = (uint)!(bool)uVar1;
    if ((local_55 & 1) == 0) {
      Status::~Status((Status *)0x1aee04);
    }
    if (local_5c == 0) {
      local_5d = 0;
      EncodeMetadata(in_RSI);
      uVar2 = Status::ok(in_RDI);
      if (!(bool)uVar2) {
        local_5d = 1;
      }
      local_5c = (uint)!(bool)uVar2;
      if ((local_5d & 1) == 0) {
        Status::~Status((Status *)0x1aee9e);
      }
      if (local_5c == 0) {
        uVar5 = (*in_RSI->_vptr_PointCloudEncoder[4])();
        if ((uVar5 & 1) == 0) {
          __a = &local_81;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffee0,
                     (char *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffed8)),__a);
          Status::Status((Status *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                         in_stack_fffffffffffffe9c,(string *)0x1aef07);
          std::__cxx11::string::~string(local_80);
          std::allocator<char>::~allocator(&local_81);
        }
        else {
          uVar5 = (*in_RSI->_vptr_PointCloudEncoder[5])();
          if ((uVar5 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffee0,
                       (char *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffed8)),
                       in_stack_fffffffffffffed0);
            Status::Status((Status *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                           in_stack_fffffffffffffe9c,(string *)0x1aefc8);
            std::__cxx11::string::~string(local_a8);
            std::allocator<char>::~allocator(&local_a9);
          }
          else {
            local_aa = 0;
            (*in_RSI->_vptr_PointCloudEncoder[6])(in_RDI);
            bVar3 = Status::ok(in_RDI);
            if (!bVar3) {
              local_aa = 1;
            }
            local_5c = (uint)!bVar3;
            if ((local_aa & 1) == 0) {
              Status::~Status((Status *)0x1af0be);
            }
            if (local_5c == 0) {
              uVar5 = (*in_RSI->_vptr_PointCloudEncoder[7])();
              if ((uVar5 & 1) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffee0,
                           (char *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffed8)),
                           in_stack_fffffffffffffed0);
                Status::Status((Status *)
                               CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                               in_stack_fffffffffffffe9c,(string *)0x1af127);
                std::__cxx11::string::~string(local_d0);
                std::allocator<char>::~allocator(&local_d1);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffee0,
                           (char *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffed8)),
                           in_stack_fffffffffffffed0);
                bVar4 = DracoOptions<int>::GetGlobalBool
                                  ((DracoOptions<int> *)
                                   CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                   false);
                std::__cxx11::string::~string(local_f8);
                std::allocator<char>::~allocator(&local_f9);
                if ((bVar4 & 1) != 0) {
                  (*in_RSI->_vptr_PointCloudEncoder[0xc])();
                }
                OkStatus();
              }
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

Status PointCloudEncoder::Encode(const EncoderOptions &options,
                                 EncoderBuffer *out_buffer) {
  options_ = &options;
  buffer_ = out_buffer;

  // Cleanup from previous runs.
  attributes_encoders_.clear();
  attribute_to_encoder_map_.clear();
  attributes_encoder_ids_order_.clear();

  if (!point_cloud_) {
    return Status(Status::DRACO_ERROR, "Invalid input geometry.");
  }
  DRACO_RETURN_IF_ERROR(EncodeHeader())
  DRACO_RETURN_IF_ERROR(EncodeMetadata())
  if (!InitializeEncoder()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize encoder.");
  }
  if (!EncodeEncoderData()) {
    return Status(Status::DRACO_ERROR, "Failed to encode internal data.");
  }
  DRACO_RETURN_IF_ERROR(EncodeGeometryData());
  if (!EncodePointAttributes()) {
    return Status(Status::DRACO_ERROR, "Failed to encode point attributes.");
  }
  if (options.GetGlobalBool("store_number_of_encoded_points", false)) {
    ComputeNumberOfEncodedPoints();
  }
  return OkStatus();
}